

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_buffer_sizes.c
# Opt level: O0

int check_block_sizes_short(test_state *state)

{
  undefined8 uVar1;
  int iVar2;
  long in_RDI;
  size_t tmp;
  int status;
  int bs;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x28);
  iVar3 = 8;
  while( true ) {
    if (0x40 < iVar3) {
      *(undefined8 *)(in_RDI + 0x28) = uVar1;
      return 0;
    }
    *(int *)(*(long *)(in_RDI + 0x58) + 0x34) = iVar3;
    *(int *)(*(long *)(in_RDI + 0x58) + 0x38) =
         (int)(*(ulong *)(in_RDI + 0x30) / (ulong)(long)(iVar3 * *(int *)(in_RDI + 0xc)));
    *(long *)(in_RDI + 0x28) = (*(long *)(in_RDI + 0x30) - (long)(iVar3 << 1)) + 4;
    iVar2 = encode_decode_large((test_state *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    if (iVar2 != 0) break;
    if (*(long *)(*(long *)(in_RDI + 0x58) + 0x28) != *(long *)(in_RDI + 0x30)) {
      printf("FAIL: Unexpected buffer length. Got %i expected %i\n",
             *(ulong *)(*(long *)(in_RDI + 0x58) + 0x28) & 0xffffffff,
             *(ulong *)(in_RDI + 0x30) & 0xffffffff);
      return 99;
    }
    iVar3 = iVar3 << 1;
    in_stack_ffffffffffffffe8 = 0;
  }
  return iVar2;
}

Assistant:

int check_block_sizes_short(struct test_state *state)
{
    int bs, status;
    size_t tmp;

    tmp = state->ibuf_len;
    for (bs = 8; bs <= 64; bs *= 2) {
        state->strm->block_size = bs;
        state->strm->rsi = (int)(state->buf_len
                                 / (bs * state->bytes_per_sample));
        state->ibuf_len = state->buf_len - 2 * bs + 4;
        status = encode_decode_large(state);
        if (status)
            return status;
        if (state->strm->total_out != state->buf_len) {
            printf("FAIL: Unexpected buffer length. Got %i expected %i\n",
                   (int)state->strm->total_out,
                   (int)state->buf_len);
            return 99;
        }
    }
    state->ibuf_len = tmp;
    return 0;
}